

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

bool __thiscall
duckdb::RowGroupCollection::ScheduleVacuumTasks
          (RowGroupCollection *this,CollectionCheckpointState *checkpoint_state,VacuumState *state,
          idx_t segment_idx,bool schedule_vacuum)

{
  vector<unsigned_long,_true> *this_00;
  VacuumState *pVVar1;
  reference pvVar2;
  BaseExecutorTask *this_01;
  type executor;
  pointer this_02;
  _func_int **pp_Var3;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  TaskExecutor *pTVar7;
  _Head_base<0UL,_duckdb::Task_*,_false> local_58;
  VacuumState *local_50;
  element_type *local_48;
  TaskExecutor *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (state->can_vacuum_deletes == true) {
    if (segment_idx < state->next_vacuum_idx) {
      return true;
    }
    this_00 = &state->row_group_counts;
    local_50 = state;
    local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)segment_idx;
    pvVar2 = vector<unsigned_long,_true>::operator[](this_00,segment_idx);
    if (schedule_vacuum && *pvVar2 != 0) {
      local_48 = (element_type *)this->row_group_size;
      local_40 = (TaskExecutor *)&DAT_00000001;
      bVar6 = false;
      do {
        p_Var5 = local_38;
        if (local_38 <
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)(checkpoint_state->segments->
                   super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ).
                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(checkpoint_state->segments->
                   super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ).
                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          uVar4 = (long)local_40 * (long)local_48;
          pp_Var3 = (_func_int **)0x0;
          pTVar7 = (TaskExecutor *)0x0;
          do {
            pvVar2 = vector<unsigned_long,_true>::operator[](this_00,(size_type)p_Var5);
            if (*pvVar2 != 0) {
              pvVar2 = vector<unsigned_long,_true>::operator[](this_00,(size_type)p_Var5);
              if (uVar4 < *pvVar2 + (long)pp_Var3) break;
              pvVar2 = vector<unsigned_long,_true>::operator[](this_00,(size_type)p_Var5);
              pp_Var3 = (_func_int **)((long)pp_Var3 + *pvVar2);
              pTVar7 = (TaskExecutor *)((long)&pTVar7->scheduler + 1);
            }
            p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var5->_vptr__Sp_counted_base + 1);
          } while (p_Var5 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)(checkpoint_state->segments->
                                   super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                   ).
                                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(checkpoint_state->segments->
                                   super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                   ).
                                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        else {
          pTVar7 = (TaskExecutor *)0x0;
          pp_Var3 = (_func_int **)0x0;
        }
        pVVar1 = local_50;
        if (local_40 < pTVar7) {
          bVar6 = true;
          goto LAB_0110cd4d;
        }
        local_40 = (TaskExecutor *)((long)&local_40->scheduler + 1);
        if (local_40 == (TaskExecutor *)0x4) {
          local_40 = (TaskExecutor *)0x4;
LAB_0110cd4d:
          if (bVar6 == false) {
            return false;
          }
          this_01 = (BaseExecutorTask *)operator_new(0x60);
          local_48 = (((enable_shared_from_this<duckdb::Task> *)&pVVar1->row_start)->__weak_this_).
                     internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          executor = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>
                     ::operator*(&checkpoint_state->executor);
          BaseExecutorTask::BaseExecutorTask(this_01,executor);
          this_01[1].super_Task._vptr_Task = (_func_int **)checkpoint_state;
          (this_01->super_Task)._vptr_Task = (_func_int **)&PTR__Task_024920f0;
          this_01[1].super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
          super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_50;
          this_01[1].super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
          super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_38;
          this_01[1].super_Task.token.ptr = (ProducerToken *)pTVar7;
          this_01[1].executor = local_40;
          this_01[2].super_Task._vptr_Task = pp_Var3;
          this_01[2].super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
          super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
          this_02 = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>
                    ::operator->(&checkpoint_state->executor);
          local_58._M_head_impl = (Task *)this_01;
          TaskExecutor::ScheduleTask
                    (this_02,(unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)
                             &local_58);
          if ((BaseExecutorTask *)local_58._M_head_impl != (BaseExecutorTask *)0x0) {
            (*((Task *)&(local_58._M_head_impl)->_vptr_Task)->_vptr_Task[1])();
          }
          ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_50->next_vacuum_idx)->_M_pi = p_Var5;
          *(long *)&(((enable_shared_from_this<duckdb::Task> *)&local_50->row_start)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> =
               *(long *)&(((enable_shared_from_this<duckdb::Task> *)&local_50->row_start)->
                         __weak_this_).internal.
                         super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> + (long)pp_Var3;
          return bVar6;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool RowGroupCollection::ScheduleVacuumTasks(CollectionCheckpointState &checkpoint_state, VacuumState &state,
                                             idx_t segment_idx, bool schedule_vacuum) {
	static constexpr const idx_t MAX_MERGE_COUNT = 3;

	if (!state.can_vacuum_deletes) {
		// we cannot vacuum deletes - cannot vacuum
		return false;
	}
	if (segment_idx < state.next_vacuum_idx) {
		// this segment is being vacuumed by a previously scheduled task
		return true;
	}
	if (state.row_group_counts[segment_idx] == 0) {
		// segment was already dropped - skip
		D_ASSERT(!checkpoint_state.segments[segment_idx].node);
		return false;
	}
	if (!schedule_vacuum) {
		return false;
	}
	idx_t merge_rows;
	idx_t next_idx = 0;
	idx_t merge_count;
	idx_t target_count;
	bool perform_merge = false;
	// check if we can merge row groups adjacent to the current segment_idx
	// we try merging row groups into batches of 1-3 row groups
	// our goal is to reduce the amount of row groups
	// hence we target_count should be less than merge_count for a marge to be worth it
	// we greedily prefer to merge to the lowest target_count
	// i.e. we prefer to merge 2 row groups into 1, than 3 row groups into 2
	const idx_t row_group_size = GetRowGroupSize();
	for (target_count = 1; target_count <= MAX_MERGE_COUNT; target_count++) {
		auto total_target_size = target_count * row_group_size;
		merge_count = 0;
		merge_rows = 0;
		for (next_idx = segment_idx; next_idx < checkpoint_state.segments.size(); next_idx++) {
			if (state.row_group_counts[next_idx] == 0) {
				continue;
			}
			if (merge_rows + state.row_group_counts[next_idx] > total_target_size) {
				// does not fit
				break;
			}
			// we can merge this row group together with the other row group
			merge_rows += state.row_group_counts[next_idx];
			merge_count++;
		}
		if (target_count < merge_count) {
			// we can reduce "merge_count" row groups to "target_count"
			// perform the merge at this level
			perform_merge = true;
			break;
		}
	}
	if (!perform_merge) {
		return false;
	}
	// schedule the vacuum task
	auto vacuum_task = make_uniq<VacuumTask>(checkpoint_state, state, segment_idx, merge_count, target_count,
	                                         merge_rows, state.row_start);
	checkpoint_state.executor->ScheduleTask(std::move(vacuum_task));
	// skip vacuuming by the row groups we have merged
	state.next_vacuum_idx = next_idx;
	state.row_start += merge_rows;
	return true;
}